

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall r_code::list<r_exec::Input>::push_front_new_cell(list<r_exec::Input> *this,Input *t)

{
  _Object *p_Var1;
  _Object *p_Var2;
  long *plVar3;
  value_type local_58;
  
  local_58.data.bindings.object = (_Object *)0x0;
  local_58.data.abstraction.object._0_1_ = 0;
  local_58.data.abstraction.object._1_7_ = 0;
  local_58.data.input.object = (_Object *)0x0;
  p_Var1 = (t->bindings).object;
  if (p_Var1 == (_Object *)0x0) {
    p_Var2 = (t->abstraction).object;
  }
  else {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    p_Var2 = (t->abstraction).object;
    local_58.data.bindings.object = p_Var1;
  }
  if (p_Var2 != (_Object *)0x0) {
    local_58.data.abstraction.object._0_1_ = SUB81(p_Var2,0);
    local_58.data.abstraction.object._1_7_ = (undefined7)((ulong)p_Var2 >> 8);
    if (p_Var2 != (_Object *)0x0) {
      LOCK();
      (p_Var2->refCount).super___atomic_base<long>._M_i =
           (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
    }
  }
  p_Var1 = (t->input).object;
  if ((p_Var1 != (_Object *)0x0) && (local_58.data.input.object = p_Var1, p_Var1 != (_Object *)0x0))
  {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  local_58.data.ijt = t->ijt;
  local_58.data.eligible_cause = SUB81(*(undefined8 *)&t->eligible_cause,0);
  local_58.data._25_7_ = SUB87((ulong)*(undefined8 *)&t->eligible_cause >> 8,0);
  local_58.next = this->used_cells_head;
  local_58.prev = -1;
  std::vector<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
  ::push_back(&this->cells,&local_58);
  this->used_cells_head =
       ((long)(this->cells).
              super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->cells).
              super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 + -1;
  if (local_58.data.input.object != (_Object *)0x0) {
    LOCK();
    ((local_58.data.input.object)->refCount).super___atomic_base<long>._M_i =
         ((local_58.data.input.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_58.data.input.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_58.data.input.object)->_vptr__Object[1])();
    }
  }
  plVar3 = (long *)CONCAT71(local_58.data.abstraction.object._1_7_,
                            local_58.data.abstraction.object._0_1_);
  if (plVar3 != (long *)0x0) {
    LOCK();
    plVar3[1] = plVar3[1] + -1;
    UNLOCK();
    if (plVar3[1] < 1) {
      (**(code **)(*plVar3 + 8))();
    }
  }
  if (local_58.data.bindings.object != (_Object *)0x0) {
    LOCK();
    ((local_58.data.bindings.object)->refCount).super___atomic_base<long>._M_i =
         ((local_58.data.bindings.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_58.data.bindings.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_58.data.bindings.object)->_vptr__Object[1])();
    }
  }
  return;
}

Assistant:

void push_front_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = used_cells_head;
        c.prev = null;
        cells.push_back(c);
        used_cells_head = cells.size() - 1;
    }